

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_digit.c
# Opt level: O0

int get_digit_sequence_score(NJDNode *start,NJDNode *end)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long in_RSI;
  long in_RDI;
  int score;
  char *buff_string;
  char *buff_pos_group2;
  char *buff_pos_group1;
  char *in_stack_ffffffffffffffc8;
  int local_2c;
  
  local_2c = 0;
  if (*(long *)(in_RDI + 0x68) != 0) {
    pcVar2 = NJDNode_get_pos_group1(*(NJDNode **)(in_RDI + 0x68));
    pcVar3 = NJDNode_get_pos_group2(*(NJDNode **)(in_RDI + 0x68));
    pcVar4 = NJDNode_get_string(*(NJDNode **)(in_RDI + 0x68));
    iVar1 = strcmp(pcVar2,anon_var_dwarf_b317d);
    if (iVar1 == 0) {
      local_2c = 2;
    }
    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d1e);
    if ((iVar1 == 0) || (iVar1 = strcmp(pcVar2,anon_var_dwarf_b2d35), iVar1 == 0)) {
      local_2c = local_2c + 1;
    }
    if (pcVar4 != (char *)0x0) {
      iVar1 = is_period(in_stack_ffffffffffffffc8);
      if (iVar1 == 1) {
        if (*(long *)(*(long *)(in_RDI + 0x68) + 0x68) != 0) {
          pcVar2 = NJDNode_get_pos_group1(*(NJDNode **)(*(long *)(in_RDI + 0x68) + 0x68));
          iVar1 = strcmp(pcVar2,anon_var_dwarf_b48b2 + 9);
          if (iVar1 == 0) {
            local_2c = local_2c + -5;
          }
        }
      }
      else {
        iVar1 = strcmp(pcVar4,anon_var_dwarf_b3187);
        if (iVar1 == 0) {
          local_2c = local_2c + -2;
        }
        else {
          iVar1 = strcmp(pcVar4,anon_var_dwarf_1392);
          if (iVar1 == 0) {
            local_2c = local_2c + -2;
          }
          else {
            iVar1 = strcmp(pcVar4,anon_var_dwarf_b319b);
            if (iVar1 == 0) {
              local_2c = local_2c + -2;
            }
            else {
              iVar1 = strcmp(pcVar4,anon_var_dwarf_b31a5);
              if (iVar1 == 0) {
                local_2c = local_2c + -2;
              }
              else {
                iVar1 = strcmp(pcVar4,anon_var_dwarf_b31af);
                if (iVar1 == 0) {
                  local_2c = local_2c + -2;
                }
                else {
                  iVar1 = strcmp(pcVar4,anon_var_dwarf_132e);
                  if (iVar1 == 0) {
                    if (*(long *)(*(long *)(in_RDI + 0x68) + 0x68) != 0) {
                      pcVar2 = NJDNode_get_pos_group1
                                         (*(NJDNode **)(*(long *)(in_RDI + 0x68) + 0x68));
                      iVar1 = strcmp(pcVar2,anon_var_dwarf_b48b2 + 9);
                      if (iVar1 == 0) {
                        local_2c = local_2c + -2;
                      }
                    }
                  }
                  else {
                    iVar1 = strcmp(pcVar4,anon_var_dwarf_1342);
                    if (iVar1 == 0) {
                      local_2c = local_2c + -2;
                    }
                    else {
                      iVar1 = strcmp(pcVar4,anon_var_dwarf_b31cd);
                      if (iVar1 == 0) {
                        local_2c = local_2c + -2;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (*(long *)(*(long *)(in_RDI + 0x68) + 0x68) != 0) {
      pcVar2 = NJDNode_get_string(*(NJDNode **)(*(long *)(in_RDI + 0x68) + 0x68));
      iVar1 = strcmp(pcVar2,anon_var_dwarf_b31cd);
      if (iVar1 == 0) {
        local_2c = local_2c + -2;
      }
    }
  }
  if (*(long *)(in_RSI + 0x70) != 0) {
    pcVar2 = NJDNode_get_pos_group1(*(NJDNode **)(in_RSI + 0x70));
    pcVar3 = NJDNode_get_pos_group2(*(NJDNode **)(in_RSI + 0x70));
    pcVar4 = NJDNode_get_string(*(NJDNode **)(in_RSI + 0x70));
    iVar1 = strcmp(pcVar3,anon_var_dwarf_b2d1e);
    if ((iVar1 == 0) || (iVar1 = strcmp(pcVar2,anon_var_dwarf_b2d35), iVar1 == 0)) {
      local_2c = local_2c + 2;
    }
    if (pcVar4 != (char *)0x0) {
      iVar1 = strcmp(pcVar4,anon_var_dwarf_b3187);
      if (iVar1 == 0) {
        local_2c = local_2c + -2;
      }
      else {
        iVar1 = strcmp(pcVar4,anon_var_dwarf_1392);
        if (iVar1 == 0) {
          local_2c = local_2c + -2;
        }
        else {
          iVar1 = strcmp(pcVar4,anon_var_dwarf_b319b);
          if (iVar1 == 0) {
            local_2c = local_2c + -2;
          }
          else {
            iVar1 = strcmp(pcVar4,anon_var_dwarf_b31a5);
            if (iVar1 == 0) {
              local_2c = local_2c + -2;
            }
            else {
              iVar1 = strcmp(pcVar4,anon_var_dwarf_b31af);
              if (iVar1 == 0) {
                local_2c = local_2c + -2;
              }
              else {
                iVar1 = strcmp(pcVar4,anon_var_dwarf_132e);
                if (iVar1 == 0) {
                  local_2c = local_2c + -2;
                }
                else {
                  iVar1 = strcmp(pcVar4,anon_var_dwarf_1342);
                  if (iVar1 == 0) {
                    if (*(long *)(*(long *)(in_RSI + 0x70) + 0x70) != 0) {
                      pcVar2 = NJDNode_get_pos_group1
                                         (*(NJDNode **)(*(long *)(in_RSI + 0x70) + 0x70));
                      iVar1 = strcmp(pcVar2,anon_var_dwarf_b48b2 + 9);
                      if (iVar1 == 0) {
                        local_2c = local_2c + -2;
                      }
                    }
                  }
                  else {
                    iVar1 = strcmp(pcVar4,anon_var_dwarf_b31cd);
                    if (iVar1 == 0) {
                      local_2c = local_2c + -2;
                    }
                    else {
                      iVar1 = is_period(in_stack_ffffffffffffffc8);
                      if (iVar1 == 1) {
                        local_2c = local_2c + 4;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_2c;
}

Assistant:

static int get_digit_sequence_score(NJDNode * start, NJDNode * end)
{
   const char *buff_pos_group1 = NULL;
   const char *buff_pos_group2 = NULL;
   const char *buff_string = NULL;
   int score = 0;

   if (start->prev) {
      buff_pos_group1 = NJDNode_get_pos_group1(start->prev);
      buff_pos_group2 = NJDNode_get_pos_group2(start->prev);
      buff_string = NJDNode_get_string(start->prev);
      if (strcmp(buff_pos_group1, NJD_SET_DIGIT_SUUSETSUZOKU) == 0)     /* prev pos_group1 */
         score += 2;
      if (strcmp(buff_pos_group2, NJD_SET_DIGIT_JOSUUSHI) == 0 || strcmp(buff_pos_group1, NJD_SET_DIGIT_FUKUSHIKANOU) == 0)     /* prev pos_group1 and pos_group2 */
         score += 1;
      if (buff_string != NULL) {
         if (is_period(buff_string) == 1) {
            if (!start->prev->prev
                || strcmp(NJDNode_get_pos_group1(start->prev->prev), NJD_SET_DIGIT_KAZU) != 0)
               score += 0;
            else
               score -= 5;
         } else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN1) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN2) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN3) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN4) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN5) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_KAKKO1) == 0) {
            if (!start->prev->prev
                || strcmp(NJDNode_get_pos_group1(start->prev->prev), NJD_SET_DIGIT_KAZU) != 0)
               score += 0;
            else
               score -= 2;
         } else if (strcmp(buff_string, NJD_SET_DIGIT_KAKKO2) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_BANGOU) == 0)
            score -= 2;
      }
      if (start->prev->prev) {
         buff_string = NJDNode_get_string(start->prev->prev);   /* prev prev string */
         if (strcmp(buff_string, NJD_SET_DIGIT_BANGOU) == 0)
            score -= 2;
      }
   }
   if (end->next) {
      buff_pos_group1 = NJDNode_get_pos_group1(end->next);
      buff_pos_group2 = NJDNode_get_pos_group2(end->next);      /* next pos_group2 */
      buff_string = NJDNode_get_string(end->next);      /* next string */
      if (strcmp(buff_pos_group2, NJD_SET_DIGIT_JOSUUSHI) == 0
          || strcmp(buff_pos_group1, NJD_SET_DIGIT_FUKUSHIKANOU) == 0)
         score += 2;
      if (buff_string != NULL) {
         if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN1) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN2) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN3) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN4) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_HAIHUN5) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_KAKKO1) == 0)
            score -= 2;
         else if (strcmp(buff_string, NJD_SET_DIGIT_KAKKO2) == 0) {
            if (!end->next->next
                || strcmp(NJDNode_get_pos_group1(end->next->next), NJD_SET_DIGIT_KAZU) != 0)
               score += 0;
            else
               score -= 2;
         } else if (strcmp(buff_string, NJD_SET_DIGIT_BANGOU) == 0)
            score -= 2;
         else if (is_period(buff_string) == 1)
            score += 4;
      }
   }

   return score;
}